

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  ZSTD_fseCTables_t *nextEntropy_00;
  ZSTD_strategy ZVar1;
  seqDef *sequences;
  seqDef *psVar2;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  BYTE *mlCodeTable;
  BYTE *src;
  bool bVar3;
  uint disableLiteralCompression;
  size_t err_code;
  size_t sVar4;
  size_t sVar5;
  byte bVar6;
  uint suspectUncompressible;
  ulong nbSeq;
  byte *pbVar7;
  bool bVar8;
  ZSTD_symbolEncodingTypeStats_t stats;
  
  sequences = seqStorePtr->sequencesStart;
  psVar2 = seqStorePtr->sequences;
  nbSeq = (long)psVar2 - (long)sequences >> 3;
  ZVar1 = (cctxParams->cParams).strategy;
  ofCodeTable = seqStorePtr->ofCode;
  llCodeTable = seqStorePtr->llCode;
  mlCodeTable = seqStorePtr->mlCode;
  src = seqStorePtr->litStart;
  if (psVar2 == sequences) {
    suspectUncompressible = 1;
  }
  else {
    suspectUncompressible = (uint)(0x13 < (ulong)((long)seqStorePtr->lit - (long)src) / nbSeq);
  }
  disableLiteralCompression = 0;
  if (cctxParams->literalCompressionMode != ZSTD_ps_enable) {
    if (cctxParams->literalCompressionMode == ZSTD_ps_disable) {
      disableLiteralCompression = 1;
    }
    else if (ZVar1 == ZSTD_fast) {
      disableLiteralCompression = (uint)((cctxParams->cParams).targetLength != 0);
    }
  }
  sVar4 = ZSTD_compressLiterals
                    (dst,dstCapacity,src,(long)seqStorePtr->lit - (long)src,
                     (void *)((long)entropyWorkspace + 0xd4),0x2204,&prevEntropy->huf,
                     &nextEntropy->huf,ZVar1,disableLiteralCompression,suspectUncompressible,
                     (int)entropyWkspSize);
  sVar5 = sVar4;
  if ((sVar4 < 0xffffffffffffff89) && (sVar5 = 0xffffffffffffffba, 3 < (long)(dstCapacity - sVar4)))
  {
    pbVar7 = (byte *)(sVar4 + (long)dst);
    if (nbSeq < 0x80) {
      *pbVar7 = (byte)nbSeq;
      pbVar7 = pbVar7 + 1;
    }
    else if (nbSeq < 0x7f00) {
      *pbVar7 = (byte)(nbSeq >> 8) | 0x80;
      pbVar7[1] = (byte)nbSeq;
      pbVar7 = pbVar7 + 2;
    }
    else {
      *pbVar7 = 0xff;
      *(short *)(pbVar7 + 1) = (short)nbSeq + -0x7f00;
      pbVar7 = pbVar7 + 3;
    }
    nextEntropy_00 = &nextEntropy->fse;
    if (psVar2 == sequences) {
      switchD_00b1422a::default(nextEntropy_00,&prevEntropy->fse,0xde0);
      sVar5 = (long)pbVar7 - (long)dst;
    }
    else {
      ZSTD_buildSequencesStatistics
                (&stats,seqStorePtr,nbSeq,&prevEntropy->fse,nextEntropy_00,pbVar7 + 1,
                 (BYTE *)((long)dst + dstCapacity),ZVar1,(uint *)entropyWorkspace,
                 (void *)((long)entropyWorkspace + 0xd4),0x2204);
      sVar5 = stats.size;
      if (stats.size < 0xffffffffffffff89) {
        *pbVar7 = (char)(stats.Offtype << 4) + (char)(stats.LLtype << 6) +
                  (char)stats.MLtype * '\x04';
        pbVar7 = pbVar7 + 1 + stats.size;
        sVar5 = ZSTD_encodeSequences
                          (pbVar7,(long)((long)dst + dstCapacity) - (long)pbVar7,
                           (nextEntropy->fse).matchlengthCTable,mlCodeTable,
                           nextEntropy_00->offcodeCTable,ofCodeTable,
                           (nextEntropy->fse).litlengthCTable,llCodeTable,sequences,nbSeq,
                           stats.longOffsets,(int)entropyWkspSize);
        if (sVar5 < 0xffffffffffffff89) {
          pbVar7 = pbVar7 + sVar5;
          bVar8 = 3 < sVar5 + stats.lastCountSize;
          bVar3 = bVar8 || stats.lastCountSize == 0;
          sVar5 = sVar4;
          if (!bVar8 && stats.lastCountSize != 0) {
            sVar5 = 0;
          }
        }
        else {
          bVar3 = false;
        }
        if (bVar3) {
          sVar5 = (long)pbVar7 - (long)dst;
        }
      }
    }
  }
  if ((sVar5 == 0) || ((srcSize <= dstCapacity && (sVar5 == 0xffffffffffffffba)))) {
    sVar5 = 0;
  }
  else if (sVar5 < 0xffffffffffffff89) {
    ZVar1 = (cctxParams->cParams).strategy;
    bVar6 = 6;
    if (7 < (int)ZVar1) {
      bVar6 = (char)ZVar1 - 1;
    }
    if ((srcSize - (srcSize >> (bVar6 & 0x3f))) - 2 <= sVar5) {
      sVar5 = 0;
    }
  }
  return sVar5;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(
                    const seqStore_t* seqStorePtr,
                    const ZSTD_entropyCTables_t* prevEntropy,
                          ZSTD_entropyCTables_t* nextEntropy,
                    const ZSTD_CCtx_params* cctxParams,
                          void* dst, size_t dstCapacity,
                          size_t srcSize,
                          void* entropyWorkspace, size_t entropyWkspSize,
                          int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity)) {
        DEBUGLOG(4, "not enough dstCapacity (%zu) for ZSTD_entropyCompressSeqStore_internal()=> do not compress block", dstCapacity);
        return 0;  /* block not compressed */
    }
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(5, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    /* libzstd decoder before  > v1.5.4 is not compatible with compressed blocks of size ZSTD_BLOCKSIZE_MAX exactly.
     * This restriction is indirectly already fulfilled by respecting ZSTD_minGain() condition above.
     */
    assert(cSize < ZSTD_BLOCKSIZE_MAX);
    return cSize;
}